

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O2

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  U32 val;
  int iVar9;
  uint uVar10;
  char *__assertion;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  uint *puVar14;
  int iVar15;
  bool bVar16;
  size_t sStack_70;
  char buffer [8];
  
  if (hbSize < 8) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    memcpy(buffer,headerBuffer,hbSize);
    sVar6 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,buffer,8);
    sStack_70 = 0xffffffffffffffec;
    if (sVar6 <= hbSize) {
      sStack_70 = sVar6;
    }
    if (0xffffffffffffff88 < sVar6) {
      sStack_70 = sVar6;
    }
  }
  else {
    uVar3 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar3 * 2);
    uVar4 = *headerBuffer & 0xf;
    if (uVar4 < 0xb) {
      uVar10 = *headerBuffer >> 4;
      *tableLogPtr = uVar4 + 5;
      iVar9 = 0x20 << (sbyte)uVar4;
      val = iVar9 + 1;
      iVar5 = uVar4 + 6;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar14 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar16 = true;
      uVar4 = 4;
      uVar13 = 0;
      puVar12 = (uint *)headerBuffer;
      do {
        uVar11 = uVar13;
        if (!bVar16) {
          while( true ) {
            uVar7 = 0;
            if ((~uVar10 | 0x80000000) != 0) {
              for (; ((~uVar10 | 0x80000000) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if (uVar7 < 0x18) break;
            if (puVar2 < puVar12) {
              uVar4 = uVar4 + ((int)puVar12 - (int)puVar2) * 8 & 0x1f;
              puVar12 = puVar14;
            }
            else {
              puVar12 = (uint *)((long)puVar12 + 3);
            }
            uVar10 = *puVar12 >> (sbyte)uVar4;
            uVar11 = uVar11 + 0x24;
          }
          uVar10 = uVar10 >> ((byte)(uVar7 & 0xfffffffe) & 0x1f) & 3;
          if (uVar10 == 3) {
            __assertion = "(bitStream & 3) < 3";
            uVar3 = 0x6a;
LAB_001f5a66:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                          ,uVar3,
                          "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                         );
          }
          uVar13 = (uVar7 >> 1) * 3 + uVar11 + uVar10;
          uVar8 = uVar4 + (uVar7 & 0xfffffffe) + 2;
          if (uVar3 <= uVar13) {
            uVar13 = uVar10 + (uVar7 >> 1) * 3 + uVar11;
            goto LAB_001f59cf;
          }
          if ((puVar2 < puVar12) && (puVar14 < (uint *)((long)puVar12 + (ulong)(uVar8 >> 3)))) {
            uVar4 = uVar8 + ((int)puVar12 - (int)puVar14) * 8 & 0x1f;
            puVar12 = puVar14;
          }
          else {
            if (0x1f < uVar8) {
              __assertion = "(bitCount >> 3) <= 3";
              uVar3 = 0x79;
              goto LAB_001f5a66;
            }
            uVar4 = uVar8 & 7;
            puVar12 = (uint *)((long)puVar12 + (ulong)(uVar8 >> 3));
          }
          uVar10 = *puVar12 >> (sbyte)uVar4;
        }
        uVar11 = iVar9 * 2 - 1;
        uVar7 = uVar11 - val;
        uVar8 = iVar9 - 1U & uVar10;
        if (uVar8 < uVar7) {
          iVar15 = iVar5 + -1;
        }
        else {
          uVar10 = uVar10 & uVar11;
          if ((int)uVar10 < iVar9) {
            uVar7 = 0;
          }
          uVar8 = uVar10 - uVar7;
          iVar15 = iVar5;
        }
        iVar1 = uVar8 - 1;
        if ((int)uVar8 < 1) {
          if (uVar8 != 0) {
            __assert_fail("count == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                          ,0x97,
                          "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                         );
          }
          val = val - 1;
        }
        else {
          val = val - iVar1;
        }
        normalizedCounter[uVar13] = (short)iVar1;
        bVar16 = iVar1 != 0;
        if (iVar9 < 2) {
          __assert_fail("threshold > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                        ,0x9d,
                        "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                       );
        }
        uVar8 = iVar15 + uVar4;
        uVar13 = uVar13 + 1;
        if ((int)val < iVar9) {
          if ((int)val < 2) {
LAB_001f59cf:
            if (val != 1) {
              return 0xffffffffffffffec;
            }
            if (uVar13 <= uVar3) {
              if (0x20 < (int)uVar8) {
                return 0xffffffffffffffec;
              }
              *maxSVPtr = uVar13 - 1;
              return (long)puVar12 + ((long)((int)(uVar8 + 7) >> 3) - (long)headerBuffer);
            }
            return 0xffffffffffffffd0;
          }
          uVar4 = ZSTD_highbit32(val);
          iVar5 = uVar4 + 1;
          iVar9 = 1 << ((byte)uVar4 & 0x1f);
        }
        if (uVar3 <= uVar13) {
          return 0xffffffffffffffec;
        }
        if ((puVar2 < puVar12) && (puVar14 < (uint *)((long)puVar12 + (long)((int)uVar8 >> 3)))) {
          uVar4 = uVar8 + ((int)puVar12 - (int)puVar14) * 8 & 0x1f;
          puVar12 = puVar14;
        }
        else {
          uVar4 = uVar8 & 7;
          puVar12 = (uint *)((long)puVar12 + (long)((int)uVar8 >> 3));
        }
        uVar10 = *puVar12 >> (sbyte)uVar4;
      } while( true );
    }
    sStack_70 = 0xffffffffffffffd4;
  }
  return sStack_70;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}